

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

_DecodeResult
decode_internal(_CodeInfo *_ci,int supportOldIntr,_DInst *result,uint maxResultCount,
               uint *usedInstructionsCount)

{
  ushort uVar1;
  _DecodeResult _Var2;
  uint in_ECX;
  long lVar3;
  undefined1 *in_RDX;
  int in_ESI;
  void *in_RDI;
  undefined4 *in_R8;
  uint mfc;
  uint diStructSize;
  uint features;
  _DInst *maxResultAddr;
  _DInst *pdi;
  _DecodeResult ret;
  _OffsetType codeOffset;
  int codeLen;
  uint8_t *code;
  _PrefixState ps;
  _CodeInfo ci;
  uint local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  _DecodeResult local_a4;
  undefined1 local_88 [8];
  int local_80;
  _DInst *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  _PrefixState *in_stack_ffffffffffffffa0;
  _CodeInfo *in_stack_ffffffffffffffa8;
  _CodeInfo *ci_00;
  undefined1 *local_40;
  int local_38;
  uint local_30;
  
  memcpy(&stack0xffffffffffffffa8,in_RDI,0x30);
  if (in_ESI == 0) {
    local_c0 = 0x40;
    lVar3 = (ulong)in_ECX * 0x40;
  }
  else {
    local_c0 = 0xa8;
    lVar3 = (ulong)in_ECX * 0xa8;
  }
  local_b8 = in_RDX + lVar3;
  local_80 = 1;
  local_b0 = in_RDX;
LAB_00105d7a:
  do {
    local_a4 = DECRES_SUCCESS;
    ci_00 = in_stack_ffffffffffffffa8;
    if (local_38 < 1) {
LAB_00106074:
      *in_R8 = (int)((ulong)((long)local_b0 - (long)in_RDX) / (ulong)local_c0);
      *(_CodeInfo **)((long)in_RDI + 0x10) = ci_00;
      return local_a4;
    }
    if (local_80 != 0) {
      memset(local_88,0,0x30);
    }
    if (local_b8 <= local_b0) {
      local_a4 = DECRES_MEMORYERR;
      goto LAB_00106074;
    }
    _Var2 = decode_inst(ci_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90);
    ci_00 = (_CodeInfo *)((long)&ci_00->codeOffset + (ulong)(byte)local_b0[0x33]);
    if (_Var2 == DECRES_SUCCESS) {
      local_a4 = DECRES_SUCCESS;
      if ((local_30 & 0x2ffc) != 0) {
        if ((local_30 & 0x2000) != 0) {
          local_40 = local_40 + 1;
          local_38 = local_38 + -1;
          ci_00 = (_CodeInfo *)((long)&in_stack_ffffffffffffffa8->codeOffset + 1);
        }
        if (((local_30 & 4) != 0) &&
           (in_stack_ffffffffffffffa8 = ci_00, (*(ushort *)(local_b0 + 0x38) & 0xf) == 0))
        goto LAB_00105d7a;
        if (((local_30 & 0x800) != 0) && ((*(ushort *)(local_b0 + 0x18) & 0x8000) != 0)) {
          local_b0 = local_b0 + local_c0;
          goto LAB_00106074;
        }
        if ((((local_30 & 0x7f8) != 0) &&
            (uVar1 = *(ushort *)(local_b0 + 0x38) & 0xf, (*(ushort *)(local_b0 + 0x38) & 0xf) != 0))
           && ((((((local_30 & 8) != 0 && (uVar1 == 1)) ||
                 (((local_30 & 0x10) != 0 && (uVar1 == 2)))) ||
                (((local_30 & 0x20) != 0 && (uVar1 == 3)))) ||
               ((((((local_30 & 0x40) != 0 && (uVar1 == 4)) ||
                  (((local_30 & 0x80) != 0 && (uVar1 == 5)))) ||
                 (((local_30 & 0x100) != 0 && (uVar1 == 6)))) ||
                ((((local_30 & 0x200) != 0 && (uVar1 == 7)) ||
                 (((local_30 & 0x400) != 0 && (uVar1 == 8)))))))))) {
          local_b0 = local_b0 + local_c0;
          goto LAB_00106074;
        }
      }
      in_stack_ffffffffffffffa8 = ci_00;
      local_b0 = local_b0 + local_c0;
      goto LAB_00105d7a;
    }
    if ((local_30 & 4) == 0) {
      memset(local_b0,0,0x40);
      *(undefined2 *)(local_b0 + 0x18) = 0xffff;
      *local_b0 = *local_40;
      local_b0[0x33] = 1;
      *(_CodeInfo **)(local_b0 + 0x10) = in_stack_ffffffffffffffa8;
      local_b0 = local_b0 + local_c0;
      if ((local_30 & 0x1000) != 0) {
        local_a4 = DECRES_SUCCESS;
        goto LAB_00106074;
      }
    }
    local_40 = local_40 + 1;
    local_38 = local_38 + -1;
    in_stack_ffffffffffffffa8 = (_CodeInfo *)((long)&in_stack_ffffffffffffffa8->codeOffset + 1);
  } while( true );
}

Assistant:

_DecodeResult decode_internal(_CodeInfo* _ci, int supportOldIntr, _DInst result[], unsigned int maxResultCount, unsigned int* usedInstructionsCount)
{
	_CodeInfo ci = *_ci; /* A working copy, we don't touch user's _ci except OUT params. */
	_PrefixState ps;
	/* Bookkeep these from ci below, as it makes things way simpler. */
	const uint8_t* code;
	int codeLen;
	_OffsetType codeOffset;

	_DecodeResult ret = DECRES_SUCCESS;

	/* Current working decoded instruction in results. */
	_DInst* pdi = (_DInst*)&result[0]; /* There's always a room for at least one slot, checked earlier. */
	_DInst* maxResultAddr;

	unsigned int features = ci.features;

	unsigned int diStructSize;
	/* Use next entry. */
#ifndef DISTORM_LIGHT
	if (supportOldIntr) {
		diStructSize = sizeof(_DecodedInst);
		maxResultAddr = (_DInst*)((size_t)&result[0] + (maxResultCount * sizeof(_DecodedInst)));
	}
	else
#endif /* DISTORM_LIGHT */
	{
		diStructSize = sizeof(_DInst);
		maxResultAddr = &result[maxResultCount];
	}

	ci.addrMask = (_OffsetType)-1;

#ifdef DISTORM_LIGHT
	supportOldIntr; /* Unreferenced. */

	/*
	 * Only truncate address if we are using the decompose interface.
	 * Otherwise, we use the textual interface which needs full addresses for formatting bytes output.
	 * So distorm_format will truncate later.
	 */
	if (features & DF_MAXIMUM_ADDR32) ci.addrMask = 0xffffffff;
	else if (features & DF_MAXIMUM_ADDR16) ci.addrMask = 0xffff;
#endif

	ps.count = 1; /* Force zero'ing ps below. */

	/* Decode instructions as long as we have what to decode/enough room in entries. */
	while (ci.codeLen > 0) {
		code = ci.code;
		codeLen = ci.codeLen;
		codeOffset = ci.codeOffset;

		if (ps.count) memset(&ps, 0, sizeof(ps));

		/**** INSTRUCTION DECODING NEXT: ****/

		/* Make sure we didn't run out of output entries. */
		if (pdi >= maxResultAddr) {
			ret = DECRES_MEMORYERR;
			break;
		}

		ret = decode_inst(&ci, &ps, code, pdi);
		/* decode_inst keeps track (only if successful!) for code and codeLen but ignores codeOffset, fix it here. */
		ci.codeOffset += pdi->size;

		if (ret == DECRES_SUCCESS) {

			if (features & (DF_SINGLE_BYTE_STEP | DF_RETURN_FC_ONLY | DF_STOP_ON_PRIVILEGED | DF_STOP_ON_FLOW_CONTROL)) {

				/* Sync codeinfo, remember that currently it points to beginning of the instruction and prefixes if any. */
				if (features & DF_SINGLE_BYTE_STEP) {
					ci.code = code + 1;
					ci.codeLen = codeLen - 1;
					ci.codeOffset = codeOffset + 1;
				}

				/* See if we need to filter this instruction. */
				if ((features & DF_RETURN_FC_ONLY) && (META_GET_FC(pdi->meta) == FC_NONE)) {
					continue;
				}

				/* Check whether we need to stop on any feature. */
				if ((features & DF_STOP_ON_PRIVILEGED) && (FLAG_GET_PRIVILEGED(pdi->flags))) {
					pdi = (_DInst*)((char*)pdi + diStructSize);
					break; /* ret = DECRES_SUCCESS; */
				}

				if (features & DF_STOP_ON_FLOW_CONTROL) {
					unsigned int mfc = META_GET_FC(pdi->meta);
					if (mfc && (((features & DF_STOP_ON_CALL) && (mfc == FC_CALL)) ||
						((features & DF_STOP_ON_RET) && (mfc == FC_RET)) ||
						((features & DF_STOP_ON_SYS) && (mfc == FC_SYS)) ||
						((features & DF_STOP_ON_UNC_BRANCH) && (mfc == FC_UNC_BRANCH)) ||
						((features & DF_STOP_ON_CND_BRANCH) && (mfc == FC_CND_BRANCH)) ||
						((features & DF_STOP_ON_INT) && (mfc == FC_INT)) ||
						((features & DF_STOP_ON_CMOV) && (mfc == FC_CMOV)) ||
						((features & DF_STOP_ON_HLT) && (mfc == FC_HLT)))) {
						pdi = (_DInst*)((char*)pdi + diStructSize);
						break; /* ret = DECRES_SUCCESS; */
					}
				}
			}

			/* Allocate at least one more entry to use, for the next instruction. */
			pdi = (_DInst*)((char*)pdi + diStructSize);
		}
		else { /* ret == DECRES_INPUTERR */

			/* Handle failure of decoding last instruction. */
			if ((!(features & DF_RETURN_FC_ONLY))) {
				memset(pdi, 0, sizeof(_DInst));
				pdi->flags = FLAG_NOT_DECODABLE;
				pdi->imm.byte = *code;
				pdi->size = 1;
				pdi->addr = codeOffset & ci.addrMask;
				pdi = (_DInst*)((char*)pdi + diStructSize);

				/* If an instruction wasn't decoded then stop on undecodeable if set. */
				if (features & DF_STOP_ON_UNDECODEABLE) {
					ret = DECRES_SUCCESS;
					break;
				}
			}

			/* Skip a single byte in case of a failure and retry instruction. */
			ci.code = code + 1;
			ci.codeLen = codeLen - 1;
			ci.codeOffset = codeOffset + 1;

			/* Reset return value. */
			ret = DECRES_SUCCESS;
		}
	}

	/* Set OUT params. */
	*usedInstructionsCount = (unsigned int)(((size_t)pdi - (size_t)result) / (size_t)diStructSize);
	_ci->nextOffset = ci.codeOffset;

	return ret;
}